

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createIntrinsic
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  ID IVar2;
  PSNode *pPVar3;
  raw_ostream *prVar4;
  PSNode *local_30;
  initializer_list<dg::pta::PSNode_*> local_28;
  
  bVar1 = llvm::MemTransferInst::classof((IntrinsicInst *)Inst);
  if (bVar1) {
    pPVar3 = createMemTransfer(this,(IntrinsicInst *)Inst);
    PSNodesSeq::PSNodesSeq(__return_storage_ptr__,pPVar3);
  }
  else {
    bVar1 = llvm::MemSetInst::classof((IntrinsicInst *)Inst);
    if (bVar1) {
      createMemSet(__return_storage_ptr__,this,Inst);
    }
    else {
      IVar2 = llvm::IntrinsicInst::getIntrinsicID((IntrinsicInst *)Inst);
      if (IVar2 == 0xa4) {
        local_30 = createLifetimeEnd(this,Inst);
      }
      else if (IVar2 == 0x119) {
        local_30 = createInternalLoad(this,Inst);
      }
      else {
        if (IVar2 != 0x11a) {
          if (IVar2 == 0x134) {
            createVarArg(__return_storage_ptr__,this,(IntrinsicInst *)Inst);
            return __return_storage_ptr__;
          }
          prVar4 = (raw_ostream *)llvm::errs();
          prVar4 = llvm::operator<<(prVar4,(Value *)Inst);
          llvm::raw_ostream::operator<<(prVar4,"\n");
          prVar4 = (raw_ostream *)llvm::errs();
          llvm::raw_ostream::operator<<(prVar4,"Unhandled intrinsic ^^\n");
          abort();
        }
        prVar4 = (raw_ostream *)llvm::errs();
        prVar4 = llvm::raw_ostream::operator<<
                           (prVar4,"WARNING: Saving stack may yield unsound results!: ");
        prVar4 = llvm::operator<<(prVar4,(Value *)Inst);
        llvm::raw_ostream::operator<<(prVar4,"\n");
        pPVar3 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
        local_30 = (PSNode *)0x0;
        if (pPVar3->type == ALLOC) {
          local_30 = pPVar3;
        }
      }
      local_28._M_array = &local_30;
      local_28._M_len = 1;
      PSNodesSeq::PSNodesSeq(__return_storage_ptr__,&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createIntrinsic(const llvm::Instruction *Inst) {
    using namespace llvm;

    const IntrinsicInst *I = cast<IntrinsicInst>(Inst);
    if (isa<MemTransferInst>(I)) {
        return createMemTransfer(I);
    }
    if (isa<MemSetInst>(I)) {
        return createMemSet(I);
    }

    switch (I->getIntrinsicID()) {
    case Intrinsic::vastart:
        return createVarArg(I);
    case Intrinsic::stacksave:
        errs() << "WARNING: Saving stack may yield unsound results!: " << *Inst
               << "\n";
        return {PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>())};
    case Intrinsic::stackrestore:
        return {createInternalLoad(Inst)};
    case Intrinsic::lifetime_end:
        return {createLifetimeEnd(Inst)};
    default:
        errs() << *Inst << "\n";
        errs() << "Unhandled intrinsic ^^\n";
        abort();
    }
}